

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_netstd_generator.cc
# Opt level: O1

void __thiscall
t_netstd_generator::generate_netstd_struct_tostring
          (t_netstd_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  e_req eVar2;
  _Alloc_hider _Var3;
  int iVar4;
  ostream *poVar5;
  undefined4 extraout_var;
  size_t sVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *pcVar8;
  bool bVar9;
  pointer pptVar10;
  t_struct *ptVar11;
  string tmp_count;
  string tmpvar;
  string local_108;
  ostream *local_e8;
  undefined4 local_dc;
  string local_d8;
  string local_b8;
  t_struct *local_98;
  string local_90;
  string local_70;
  string local_50;
  
  local_e8 = out;
  local_98 = tstruct;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tmp","");
  t_generator::tmp(&local_90,(t_generator *)this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_e8,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"public override string ToString()",0x21);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_b8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_e8,local_b8._M_dataplus._M_p,local_b8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"var ",4);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5," = new StringBuilder(\"",0x16);
  iVar4 = (*(local_98->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,*(char **)CONCAT44(extraout_var,iVar4),
                      ((undefined8 *)CONCAT44(extraout_var,iVar4))[1]);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"(\");",4);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"tmp","");
  t_generator::tmp(&local_b8,(t_generator *)this,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  ptVar11 = local_98;
  pptVar10 = (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if ((pptVar10 ==
       (local_98->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
       super__Vector_impl_data._M_finish) || ((*pptVar10)->req_ == T_REQUIRED)) {
    local_dc = 0;
  }
  else {
    t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"int ",4);
    _Var3._M_p = local_b8._M_dataplus._M_p;
    if (local_b8._M_dataplus._M_p == (char *)0x0) {
      std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
    }
    else {
      sVar6 = strlen(local_b8._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var3._M_p,sVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," = 0;",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
    paVar7 = &local_108.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p != paVar7) {
      operator_delete(local_108._M_dataplus._M_p);
      paVar7 = extraout_RAX;
    }
    local_dc = (undefined4)CONCAT71((int7)((ulong)paVar7 >> 8),1);
  }
  pptVar10 = (ptVar11->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  if (pptVar10 !=
      (ptVar11->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    bVar9 = false;
    do {
      eVar2 = (*pptVar10)->req_;
      generate_null_check_begin(this,local_e8,*pptVar10);
      if (((char)local_dc == '\0') || (bVar9)) {
        t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".Append(\", ",0xb);
        prop_name_abi_cxx11_(&local_d8,this,*pptVar10,false);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": \");",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"if(0 < ",7);
        _Var3._M_p = local_b8._M_dataplus._M_p;
        if (local_b8._M_dataplus._M_p == (char *)0x0) {
          std::ios::clear((int)poVar5 + (int)poVar5->_vptr_basic_ostream[-3]);
        }
        else {
          sVar6 = strlen(local_b8._M_dataplus._M_p);
          std::__ostream_insert<char,std::char_traits<char>>(poVar5,_Var3._M_p,sVar6);
        }
        ptVar11 = local_98;
        pcVar8 = "++";
        if (eVar2 == T_REQUIRED) {
          pcVar8 = "";
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,pcVar8,(ulong)((uint)(eVar2 != T_REQUIRED) * 2));
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,") { ",4);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".Append(\", \"); }",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p);
        }
        t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,".Append(\"",9);
        prop_name_abi_cxx11_(&local_d8,this,*pptVar10,false);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,": \");",5);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
      prop_name_abi_cxx11_(&local_d8,this,*pptVar10,false);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,".ToString(",10);
      poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar5,");",2);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_108._M_dataplus._M_p != &local_108.field_2) {
        operator_delete(local_108._M_dataplus._M_p);
      }
      generate_null_check_end(this,local_e8,*pptVar10);
      if (eVar2 == T_REQUIRED) {
        bVar9 = true;
      }
      pptVar10 = pptVar10 + 1;
    } while (pptVar10 !=
             (ptVar11->members_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".Append(\')\');",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"return ",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_90._M_dataplus._M_p,local_90._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,".ToString();",0xc);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_108,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_e8,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_netstd_generator::generate_netstd_struct_tostring(ostream& out, t_struct* tstruct)
{
    string tmpvar = tmp("tmp");
    out << indent() << "public override string ToString()" << endl
        << indent() << "{" << endl;
    indent_up();
    out << indent() << "var " << tmpvar << " = new StringBuilder(\"" << tstruct->get_name() << "(\");" << endl;

    const vector<t_field*>& fields = tstruct->get_members();
    vector<t_field*>::const_iterator f_iter;

    bool useFirstFlag = false;
    string tmp_count = tmp("tmp");
    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        if (!field_is_required((*f_iter)))
        {
            out << indent() << "int " << tmp_count.c_str() << " = 0;" << endl;
            useFirstFlag = true;
        }
        break;
    }

    bool had_required = false; // set to true after first required field has been processed

    for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter)
    {
        bool is_required = field_is_required(*f_iter);
        generate_null_check_begin(out, *f_iter);

        if (useFirstFlag && (!had_required))
        {
            out << indent() << "if(0 < " << tmp_count.c_str() << (is_required ? "" : "++") << ") { " << tmpvar << ".Append(\", \"); }" << endl;
            out << indent() << tmpvar << ".Append(\"" << prop_name(*f_iter) << ": \");" << endl;
        }
        else
        {
            out << indent() << tmpvar << ".Append(\", " << prop_name(*f_iter) << ": \");" << endl;
        }

        out << indent() << prop_name(*f_iter) << ".ToString(" << tmpvar << ");" << endl;

        generate_null_check_end(out, *f_iter);
        if (is_required) {
            had_required = true; // now __count must be > 0, so we don't need to check it anymore
        }
    }

    out << indent() << tmpvar << ".Append(')');" << endl
        << indent() << "return " << tmpvar << ".ToString();" << endl;
    indent_down();
    out << indent() << "}" << endl;
}